

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::QueryServiceState
          (ConsumerEndpointImpl *this,QueryServiceStateCallback *callback)

{
  bitset<3UL> *pbVar1;
  byte *pbVar2;
  TracingServiceImpl *pTVar3;
  ulong uVar4;
  _Base_ptr p_Var5;
  iterator __position;
  undefined8 uVar6;
  _Base_bitset<1UL> _Var7;
  _Rb_tree_node_base *p_Var8;
  pair<unsigned_int,_unsigned_long> *snap_kv;
  char *__s;
  _Rb_tree_node_base *p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  int iVar13;
  TraceConfig_BufferConfig *buf;
  TracingServiceState svc_state;
  long *local_118 [2];
  long local_108 [2];
  allocator<char> local_f1;
  ConsumerEndpointImpl *local_f0;
  _Any_data *local_e8;
  _Rb_tree_node_base *local_e0;
  undefined1 local_d8 [160];
  _Base_bitset<1UL> local_38;
  
  protos::gen::TracingServiceState::TracingServiceState((TracingServiceState *)local_d8);
  pTVar3 = this->service_;
  local_f0 = this;
  __s = base::GetVersionString();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)local_118,__s,&local_f1);
  ::std::__cxx11::string::_M_assign((string *)(local_d8 + 0x60));
  local_38._M_w = local_38._M_w | 0x20;
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  _Var7._M_w = local_38._M_w;
  local_d8._84_4_ =
       (undefined4)(pTVar3->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_38._M_w = local_38._M_w | 8;
  p_Var9 = (pTVar3->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var12 = &(pTVar3->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header;
  local_e8 = (_Any_data *)callback;
  if ((_Rb_tree_header *)p_Var9 == p_Var12) {
    iVar13 = 0;
  }
  else {
    iVar13 = 0;
    do {
      iVar13 = iVar13 + (uint)(*(int *)&p_Var9[0x18]._M_parent == 2);
      p_Var9 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var12);
  }
  local_38._M_w = _Var7._M_w | 0x18;
  p_Var10 = (local_f0->service_->producers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var12 = &(local_f0->service_->producers_)._M_t._M_impl.super__Rb_tree_header;
  local_d8._88_4_ = iVar13;
  if ((_Rb_tree_header *)p_Var10 != p_Var12) {
    do {
      std::
      vector<perfetto::protos::gen::TracingServiceState_Producer,_std::allocator<perfetto::protos::gen::TracingServiceState_Producer>_>
      ::emplace_back<>((vector<perfetto::protos::gen::TracingServiceState_Producer,_std::allocator<perfetto::protos::gen::TracingServiceState_Producer>_>
                        *)(local_d8 + 8));
      uVar6 = local_d8._16_8_;
      ((pointer)(local_d8._16_8_ + -0x80))->id_ = (uint)(ushort)(short)p_Var10[1]._M_color;
      *(byte *)&(((pointer)(local_d8._16_8_ + -0x80))->_has_field_).super__Base_bitset<1UL>._M_w =
           (byte)(((pointer)(local_d8._16_8_ + -0x80))->_has_field_).super__Base_bitset<1UL>._M_w |
           2;
      ::std::__cxx11::string::_M_assign((string *)&((pointer)(local_d8._16_8_ + -0x80))->name_);
      *(byte *)&(((pointer)(uVar6 + -0x80))->_has_field_).super__Base_bitset<1UL>._M_w =
           (byte)(((pointer)(uVar6 + -0x80))->_has_field_).super__Base_bitset<1UL>._M_w | 4;
      ::std::__cxx11::string::_M_assign((string *)&((pointer)(uVar6 + -0x80))->sdk_version_);
      uVar4 = (((pointer)(uVar6 + -0x80))->_has_field_).super__Base_bitset<1UL>._M_w;
      (((pointer)(uVar6 + -0x80))->_has_field_).super__Base_bitset<1UL>._M_w = uVar4 | 0x10;
      p_Var11 = p_Var10[1]._M_parent;
      ((pointer)(uVar6 + -0x80))->uid_ = *(int32_t *)((long)&p_Var11->_M_parent + 4);
      (((pointer)(uVar6 + -0x80))->_has_field_).super__Base_bitset<1UL>._M_w = uVar4 | 0x18;
      ((pointer)(uVar6 + -0x80))->pid_ = *(int32_t *)&p_Var11->_M_left;
      (((pointer)(uVar6 + -0x80))->_has_field_).super__Base_bitset<1UL>._M_w = uVar4 | 0x38;
      p_Var10 = (_Base_ptr)::std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var12);
  }
  p_Var10 = (local_f0->service_->data_sources_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
  ;
  p_Var12 = &(local_f0->service_->data_sources_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var10 != p_Var12) {
    do {
      std::
      vector<perfetto::protos::gen::TracingServiceState_DataSource,_std::allocator<perfetto::protos::gen::TracingServiceState_DataSource>_>
      ::emplace_back<>((vector<perfetto::protos::gen::TracingServiceState_DataSource,_std::allocator<perfetto::protos::gen::TracingServiceState_DataSource>_>
                        *)(local_d8 + 0x20));
      uVar6 = local_d8._40_8_;
      (((pointer)(local_d8._40_8_ + -0x40))->_has_field_).super__Base_bitset<1UL>._M_w =
           (((pointer)(local_d8._40_8_ + -0x40))->_has_field_).super__Base_bitset<1UL>._M_w | 2;
      protos::gen::DataSourceDescriptor::operator=
                ((((pointer)(local_d8._40_8_ + -0x40))->ds_descriptor_).ptr_._M_t.
                 super___uniq_ptr_impl<perfetto::protos::gen::DataSourceDescriptor,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
                 .super__Head_base<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_false>.
                 _M_head_impl,(DataSourceDescriptor *)&p_Var10[2]._M_parent);
      ((pointer)(uVar6 + -0x40))->producer_id_ = (uint)(ushort)(short)p_Var10[2]._M_color;
      pbVar1 = &((pointer)(uVar6 + -0x40))->_has_field_;
      *(byte *)&(pbVar1->super__Base_bitset<1UL>)._M_w =
           (byte)(pbVar1->super__Base_bitset<1UL>)._M_w | 4;
      p_Var10 = (_Base_ptr)::std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var12);
  }
  local_d8[0x50] = true;
  local_38._M_w = local_38._M_w | 0x80;
  p_Var10 = (local_f0->service_->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header._M_header.
            _M_left;
  p_Var9 = &(local_f0->service_->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var8 = p_Var9;
  if (p_Var10 != p_Var9) {
    do {
      local_e0 = p_Var8;
      if ((local_f0->uid_ == 0) || (local_f0->uid_ == *(uid_t *)&p_Var10[1]._M_right)) {
        std::
        vector<perfetto::protos::gen::TracingServiceState_TracingSession,_std::allocator<perfetto::protos::gen::TracingServiceState_TracingSession>_>
        ::emplace_back<>((vector<perfetto::protos::gen::TracingServiceState_TracingSession,_std::allocator<perfetto::protos::gen::TracingServiceState_TracingSession>_>
                          *)(local_d8 + 0x38));
        uVar6 = local_d8._64_8_;
        ((pointer)(local_d8._64_8_ + -0xa8))->id_ = (uint64_t)p_Var10[1]._M_parent;
        uVar4 = (((pointer)(local_d8._64_8_ + -0xa8))->_has_field_).super__Base_bitset<1UL>._M_w;
        (((pointer)(local_d8._64_8_ + -0xa8))->_has_field_).super__Base_bitset<1UL>._M_w = uVar4 | 2
        ;
        ((pointer)(local_d8._64_8_ + -0xa8))->consumer_uid_ = *(int32_t *)&p_Var10[1]._M_right;
        (((pointer)(local_d8._64_8_ + -0xa8))->_has_field_).super__Base_bitset<1UL>._M_w = uVar4 | 6
        ;
        ((pointer)(local_d8._64_8_ + -0xa8))->duration_ms_ = *(uint32_t *)&p_Var10[4]._M_right;
        (((pointer)(local_d8._64_8_ + -0xa8))->_has_field_).super__Base_bitset<1UL>._M_w =
             uVar4 | 0x46;
        ((pointer)(local_d8._64_8_ + -0xa8))->num_data_sources_ = p_Var10[0x10]._M_color;
        (((pointer)(local_d8._64_8_ + -0xa8))->_has_field_).super__Base_bitset<1UL>._M_w =
             uVar4 | 0xc6;
        ::std::__cxx11::string::_M_assign
                  ((string *)&((pointer)(local_d8._64_8_ + -0xa8))->unique_session_name_);
        *(byte *)&(((pointer)(uVar6 + -0xa8))->_has_field_).super__Base_bitset<1UL>._M_w =
             (byte)(((pointer)(uVar6 + -0xa8))->_has_field_).super__Base_bitset<1UL>._M_w | 0x10;
        p_Var5 = p_Var10[0x16]._M_right;
        for (p_Var11 = p_Var10[0x16]._M_left; p_Var11 != p_Var5;
            p_Var11 = (_Base_ptr)&p_Var11->_M_left) {
          if (p_Var11->_M_color == _S_black) {
            ((pointer)(uVar6 + -0xa8))->start_realtime_ns_ = (int64_t)p_Var11->_M_parent;
            pbVar2 = (byte *)((long)&(((pointer)(uVar6 + -0xa8))->_has_field_).
                                     super__Base_bitset<1UL>._M_w + 1);
            *pbVar2 = *pbVar2 | 1;
          }
        }
        p_Var11 = *(_Base_ptr *)(p_Var10 + 3);
        p_Var5 = p_Var10[3]._M_parent;
        if (p_Var11 != p_Var5) {
          do {
            local_118[0] = (long *)CONCAT44(local_118[0]._4_4_,*(uint *)&p_Var11->_M_parent);
            __position._M_current =
                 (((pointer)(uVar6 + -0xa8))->buffer_size_kb_).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (((pointer)(uVar6 + -0xa8))->buffer_size_kb_).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                         &((pointer)(uVar6 + -0xa8))->buffer_size_kb_,__position,(uint *)local_118);
            }
            else {
              *__position._M_current = *(uint *)&p_Var11->_M_parent;
              (((pointer)(uVar6 + -0xa8))->buffer_size_kb_).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            p_Var11 = (_Base_ptr)&p_Var11[1]._M_right;
          } while (p_Var11 != p_Var5);
        }
        p_Var9 = local_e0;
        switch(*(undefined4 *)&p_Var10[0x18]._M_parent) {
        case 0:
          local_118[0] = local_108;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"DISABLED","");
          ::std::__cxx11::string::_M_assign((string *)&((pointer)(uVar6 + -0xa8))->state_);
          break;
        case 1:
          local_118[0] = local_108;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"CONFIGURED","");
          ::std::__cxx11::string::_M_assign((string *)&((pointer)(uVar6 + -0xa8))->state_);
          break;
        case 2:
          local_118[0] = local_108;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"STARTED","");
          ::std::__cxx11::string::_M_assign((string *)&((pointer)(uVar6 + -0xa8))->state_);
          break;
        case 3:
          local_118[0] = local_108;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"STOP_WAIT","");
          ::std::__cxx11::string::_M_assign((string *)&((pointer)(uVar6 + -0xa8))->state_);
          break;
        default:
          goto switchD_002dc651_default;
        }
        *(byte *)&(((pointer)(uVar6 + -0xa8))->_has_field_).super__Base_bitset<1UL>._M_w =
             (byte)(((pointer)(uVar6 + -0xa8))->_has_field_).super__Base_bitset<1UL>._M_w | 8;
        if (local_118[0] != local_108) {
          operator_delete(local_118[0],local_108[0] + 1);
        }
      }
switchD_002dc651_default:
      p_Var10 = (_Base_ptr)::std::_Rb_tree_increment(p_Var10);
      p_Var8 = local_e0;
    } while (p_Var10 != p_Var9);
  }
  local_118[0] = (long *)CONCAT71(local_118[0]._1_7_,1);
  if (*(long *)(local_e8 + 1) == 0) {
    ::std::__throw_bad_function_call();
  }
  (**(code **)(local_e8->_M_pod_data + 0x18))
            (local_e8,(bool *)local_118,(TracingServiceState *)local_d8);
  protos::gen::TracingServiceState::~TracingServiceState((TracingServiceState *)local_d8);
  return;
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::QueryServiceState(
    QueryServiceStateCallback callback) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  TracingServiceState svc_state;

  const auto& sessions = service_->tracing_sessions_;
  svc_state.set_tracing_service_version(base::GetVersionString());
  svc_state.set_num_sessions(static_cast<int>(sessions.size()));

  int num_started = 0;
  for (const auto& kv : sessions)
    num_started += kv.second.state == TracingSession::State::STARTED ? 1 : 0;
  svc_state.set_num_sessions_started(static_cast<int>(num_started));

  for (const auto& kv : service_->producers_) {
    auto* producer = svc_state.add_producers();
    producer->set_id(static_cast<int>(kv.first));
    producer->set_name(kv.second->name_);
    producer->set_sdk_version(kv.second->sdk_version_);
    producer->set_uid(static_cast<int32_t>(kv.second->uid()));
    producer->set_pid(static_cast<int32_t>(kv.second->pid()));
  }

  for (const auto& kv : service_->data_sources_) {
    const auto& registered_data_source = kv.second;
    auto* data_source = svc_state.add_data_sources();
    *data_source->mutable_ds_descriptor() = registered_data_source.descriptor;
    data_source->set_producer_id(
        static_cast<int>(registered_data_source.producer_id));
  }

  svc_state.set_supports_tracing_sessions(true);
  for (const auto& kv : service_->tracing_sessions_) {
    const TracingSession& s = kv.second;
    // List only tracing sessions for the calling UID (or everything for root).
    if (uid_ != 0 && uid_ != s.consumer_uid)
      continue;
    auto* session = svc_state.add_tracing_sessions();
    session->set_id(s.id);
    session->set_consumer_uid(static_cast<int>(s.consumer_uid));
    session->set_duration_ms(s.config.duration_ms());
    session->set_num_data_sources(
        static_cast<uint32_t>(s.data_source_instances.size()));
    session->set_unique_session_name(s.config.unique_session_name());
    for (const auto& snap_kv : s.initial_clock_snapshot) {
      if (snap_kv.first == protos::pbzero::BUILTIN_CLOCK_REALTIME)
        session->set_start_realtime_ns(static_cast<int64_t>(snap_kv.second));
    }
    for (const auto& buf : s.config.buffers())
      session->add_buffer_size_kb(buf.size_kb());

    switch (s.state) {
      case TracingSession::State::DISABLED:
        session->set_state("DISABLED");
        break;
      case TracingSession::State::CONFIGURED:
        session->set_state("CONFIGURED");
        break;
      case TracingSession::State::STARTED:
        session->set_state("STARTED");
        break;
      case TracingSession::State::DISABLING_WAITING_STOP_ACKS:
        session->set_state("STOP_WAIT");
        break;
    }
  }
  callback(/*success=*/true, svc_state);
}